

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

bool __thiscall
BattleWithLandlord::Str2CardStyle(BattleWithLandlord *this,string *str,CardStyle *style)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  mapped_type *__v;
  BattleWithLandlord *this_00;
  pointer pCVar4;
  size_type sVar5;
  vector<CardStyle,_std::allocator<CardStyle>_> res;
  char x;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_f8;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_98;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_68;
  
  if (((str->_M_string_length == 0) || (bVar3 = std::operator==(str,""), bVar3)) ||
     (bVar3 = std::operator==(str,"pass"), bVar3)) {
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl._0_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    CardStyle::CardStyle
              ((CardStyle *)&x,PASS,0,
               (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_68,1,0);
    CardStyle::operator=(style,(CardStyle *)&x);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&local_f8);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&local_68);
    return true;
  }
  ms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ms._M_t._M_impl.super__Rb_tree_header._M_header;
  ms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  ms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    x = pcVar1[sVar5];
    __v = std::__detail::
          _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this,&x);
    std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
    _M_insert_equal<char_const&>
              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)&ms,
               __v);
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (BattleWithLandlord *)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  CardStyle::CardStyle
            ((CardStyle *)&x,PASS,0,
             (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_98,1,0);
  GenStrategy(&res,this_00,&ms,(CardStyle *)&x);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_f8);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_98);
  pCVar4 = res.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pCVar4 == res.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
LAB_0010a951:
      std::vector<CardStyle,_std::allocator<CardStyle>_>::~vector(&res);
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&ms._M_t);
      return pCVar4 != res.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
                       super__Vector_impl_data._M_finish;
    }
    CardStyle::CardStyle((CardStyle *)&x,pCVar4);
    if (local_f8._M_impl.super__Rb_tree_header._M_node_count == str->_M_string_length) {
      CardStyle::operator=(style,(CardStyle *)&x);
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&local_f8);
      goto LAB_0010a951;
    }
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&local_f8);
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

bool BattleWithLandlord::Str2CardStyle(const string &str, CardStyle &style) {
    if (str.empty() || str == "" || str == "pass") {
        style = CardStyle();
        return true;
    }

    multiset<byte> ms;
    for (auto x: str) {
        ms.insert(_name2id[x]);
    }
    auto res = GenStrategy(ms, CardStyle());
    for (auto x: res) {
        if (x.pattern.size() == str.size()) {
            style = x;
            return true;
        }
    }
    return false;
}